

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O0

void __thiscall cmCTestVC::cmCTestVC(cmCTestVC *this,cmCTest *ct,ostream *log)

{
  ostream *log_local;
  cmCTest *ct_local;
  cmCTestVC *this_local;
  
  this->_vptr_cmCTestVC = (_func_int **)&PTR__cmCTestVC_00a85aa0;
  this->CTest = ct;
  this->Log = log;
  std::__cxx11::string::string((string *)&this->CommandLineTool);
  std::__cxx11::string::string((string *)&this->SourceDirectory);
  std::__cxx11::string::string((string *)&this->UpdateCommandLine);
  Revision::Revision(&this->Unknown);
  this->PathCount[0] = 0;
  this->PathCount[1] = 0;
  this->PathCount[2] = 0;
  std::__cxx11::string::operator=((string *)&(this->Unknown).Date,"Unknown");
  std::__cxx11::string::operator=((string *)&(this->Unknown).Author,"Unknown");
  std::__cxx11::string::operator=((string *)&this->Unknown,"Unknown");
  return;
}

Assistant:

cmCTestVC::cmCTestVC(cmCTest* ct, std::ostream& log)
  : CTest(ct)
  , Log(log)
{
  this->PathCount[PathUpdated] = 0;
  this->PathCount[PathModified] = 0;
  this->PathCount[PathConflicting] = 0;
  this->Unknown.Date = "Unknown";
  this->Unknown.Author = "Unknown";
  this->Unknown.Rev = "Unknown";
}